

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O2

void __thiscall BatchResultValues::~BatchResultValues(BatchResultValues *this)

{
  CaseValues *this_00;
  pointer ppCVar1;
  
  for (ppCVar1 = (this->m_caseValues).
                 super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar1 !=
      (this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    this_00 = *ppCVar1;
    if (this_00 != (CaseValues *)0x0) {
      CaseValues::~CaseValues(this_00);
    }
    operator_delete(this_00,0x60);
  }
  std::_Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>::~_Vector_base
            (&(this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_tagNames);
  return;
}

Assistant:

~BatchResultValues (void)
	{
		for (vector<CaseValues*>::iterator i = m_caseValues.begin(); i != m_caseValues.end(); ++i)
			delete *i;
	}